

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O2

void __thiscall CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CClass *stm)

{
  CIdExp *pCVar1;
  CFieldList *pCVar2;
  element_type *peVar3;
  CMethodList *pCVar4;
  ClassInfo *this_00;
  VariablesInfo *pVVar5;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__cxx11::string::assign
            ((char *)&((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->iName);
  pCVar1 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar1 != (CIdExp *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
  }
  this_00 = (ClassInfo *)operator_new(0x88);
  ClassInfo::ClassInfo
            (this_00,&((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->iName);
  std::__shared_ptr<ClassInfo,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ClassInfo,void>
            ((__shared_ptr<ClassInfo,(__gnu_cxx::_Lock_policy)2> *)&local_30,this_00);
  std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> *)
             (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_30)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  if ((stm->parentClass)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
      super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
      super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl != (CIdExp *)0x0) {
    std::__cxx11::string::assign
              ((char *)&((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->iName);
    pCVar1 = (stm->parentClass)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>.
             _M_t.super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
             super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
    (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
    std::__cxx11::string::_M_assign
              ((string *)
               &((((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                baseClass);
  }
  pVVar5 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(pVVar5);
  std::__shared_ptr<VariablesInfo,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<VariablesInfo,void>
            ((__shared_ptr<VariablesInfo,(__gnu_cxx::_Lock_policy)2> *)&local_30,pVVar5);
  std::__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  pVVar5 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(pVVar5);
  std::__shared_ptr<VariablesInfo,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<VariablesInfo,void>
            ((__shared_ptr<VariablesInfo,(__gnu_cxx::_Lock_policy)2> *)&local_30,pVVar5);
  std::__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              definedVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  pCVar2 = (stm->fields)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>.
           _M_t.super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
           super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  if (pCVar2 != (CFieldList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
  }
  peVar3 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((peVar3->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>,
             &(peVar3->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>);
  pCVar4 = (stm->methods)._M_t.super___uniq_ptr_impl<CMethodList,_std::default_delete<CMethodList>_>
           ._M_t.super__Tuple_impl<0UL,_CMethodList_*,_std::default_delete<CMethodList>_>.
           super__Head_base<0UL,_CMethodList_*,_false>._M_head_impl;
  if (pCVar4 != (CMethodList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar4->super_IWrapper).super_PositionedNode)(pCVar4,this);
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CClass &stm )
{
//	std::cout << "class\n";
	info->iName = "";
	if( stm.id ) {
		stm.id->Accept( *this );
	}
	info->iClass = std::shared_ptr<ClassInfo>( new ClassInfo( info->iName ) );

	if( stm.parentClass ) {
		info->iName = "";
		stm.parentClass->Accept( *this );
		info->iClass->baseClass = info->iName;
	}

	info->iVariables = std::shared_ptr<VariablesInfo>( new VariablesInfo() );
    info->definedVariables = std::shared_ptr<VariablesInfo>( new VariablesInfo() );
	if( stm.fields ) {
		stm.fields->Accept( *this );
	}
	info->iClass->fields = info->iVariables;

	if( stm.methods ) {
		stm.methods->Accept( *this );
	}
}